

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-decurse.c
# Opt level: O0

_Bool borg_decurse_armour(void)

{
  _Bool _Var1;
  wchar_t wVar2;
  _Bool local_9;
  
  _Var1 = borg_uses_swaps();
  if ((_Var1) && ((decurse_armour_swap & 1U) != 0)) {
    wVar2 = borg_slot(L'\x19',sv_scroll_remove_curse);
    if (((wVar2 != L'\xffffffff') ||
        (((_Var1 = borg_equips_staff_fail(sv_staff_remove_curse), _Var1 ||
          (_Var1 = borg_spell_okay_fail(REMOVE_CURSE,0x28), _Var1)) ||
         (wVar2 = borg_slot(L'\x19',sv_scroll_star_remove_curse), wVar2 != L'\xffffffff')))) ||
       ((_Var1 = borg_equips_item(act_remove_curse,true), _Var1 ||
        (_Var1 = borg_equips_item(act_remove_curse2,true), _Var1)))) {
      _Var1 = borg_read_scroll(sv_scroll_remove_curse);
      if (((_Var1) || (_Var1 = borg_use_staff(sv_staff_remove_curse), _Var1)) ||
         ((_Var1 = borg_spell(REMOVE_CURSE), _Var1 ||
          (((_Var1 = borg_read_scroll(sv_scroll_star_remove_curse), _Var1 ||
            (_Var1 = borg_activate_item(act_remove_curse), _Var1)) ||
           (_Var1 = borg_activate_item(act_remove_curse2), _Var1)))))) {
        borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[armour_swap + -1]);
        borg_keypress(0x9c);
        local_9 = true;
      }
      else {
        local_9 = false;
      }
    }
    else {
      local_9 = false;
    }
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool borg_decurse_armour(void)
{
    /* Nothing to decurse */
    if (!borg_uses_swaps() || !decurse_armour_swap)
        return false;

    if (-1 == borg_slot(TV_SCROLL, sv_scroll_remove_curse)
        && !borg_equips_staff_fail(sv_staff_remove_curse)
        && !borg_spell_okay_fail(REMOVE_CURSE, 40)
        && -1 == borg_slot(TV_SCROLL, sv_scroll_star_remove_curse)
        && !borg_equips_item(act_remove_curse, true)
        && !borg_equips_item(act_remove_curse2, true)) {
        return false;
    }

    /* remove the curse */
    if (borg_read_scroll(sv_scroll_remove_curse)
        || borg_use_staff(sv_staff_remove_curse) || borg_spell(REMOVE_CURSE)
        || borg_read_scroll(sv_scroll_star_remove_curse)
        || borg_activate_item(act_remove_curse)
        || borg_activate_item(act_remove_curse2)) {
        /* pick the item */
        borg_keypress(all_letters_nohjkl[armour_swap - 1]);
        /* pick first curse */
        borg_keypress(KC_ENTER);

        /* Shekockazol! */
        return true;
    }

    /* Nothing to do */
    return false;
}